

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O2

void rw::d3d8::uninstance(ObjPipeline *rwpipe,Atomic *atomic)

{
  byte *pbVar1;
  int iVar2;
  Geometry *this;
  InstanceDataHeader *pIVar3;
  uint32 uVar4;
  uint16 *__src;
  int32 extraout_EDX;
  ulong uVar5;
  int32 iVar6;
  ulong uVar7;
  uint32 i;
  uint uVar8;
  MeshHeader *pMVar9;
  int *piVar10;
  
  this = atomic->geometry;
  if ((this->flags & 0x1000000) == 0) {
    return;
  }
  uVar4 = MeshHeader::guessNumTriangles(this->meshHeader);
  this->numTriangles = uVar4;
  Geometry::allocateData(this);
  Geometry::allocateMeshes(this,(uint)this->meshHeader->numMeshes,this->meshHeader->totalIndices,0);
  pIVar3 = this->instData;
  piVar10 = *(int **)(pIVar3 + 2);
  pMVar9 = this->meshHeader + 1;
  for (uVar8 = 0; uVar8 < *(ushort *)((long)&pIVar3[1].platform + 2); uVar8 = uVar8 + 1) {
    __src = d3d::lockIndices(*(void **)(piVar10 + 8),0,0,0);
    iVar2 = *piVar10;
    if (iVar2 == 0) {
      memcpy(*(void **)pMVar9,__src,(long)piVar10[3] * 2);
    }
    else {
      uVar5 = (ulong)(uint)piVar10[3];
      if (piVar10[3] < 1) {
        uVar5 = 0;
      }
      for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
        *(uint16 *)(*(long *)pMVar9 + uVar7 * 2) = __src[uVar7] + (short)iVar2;
      }
    }
    d3d::unlockIndices(*(void **)(piVar10 + 8));
    (**(code **)&rwpipe[1].super_Pipeline.platform)(this);
    pMVar9 = (MeshHeader *)&pMVar9[1].totalIndices;
    piVar10 = piVar10 + 0xe;
  }
  iVar6 = 0;
  Geometry::generateTriangles(this,(int8 *)0x0);
  pbVar1 = (byte *)((long)&this->flags + 3);
  *pbVar1 = *pbVar1 & 0xfe;
  destroyNativeData(this,iVar6,extraout_EDX);
  return;
}

Assistant:

static void
uninstance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	if((geo->flags & Geometry::NATIVE) == 0)
		return;
	assert(geo->instData != nil);
	assert(geo->instData->platform == PLATFORM_D3D8);
	geo->numTriangles = geo->meshHeader->guessNumTriangles();
	geo->allocateData();
	geo->allocateMeshes(geo->meshHeader->numMeshes, geo->meshHeader->totalIndices, 0);

	InstanceDataHeader *header = (InstanceDataHeader*)geo->instData;
	InstanceData *inst = header->inst;
	Mesh *mesh = geo->meshHeader->getMeshes();
	for(uint32 i = 0; i < header->numMeshes; i++){
		uint16 *indices = lockIndices(inst->indexBuffer, 0, 0, 0);
		if(inst->minVert == 0)
			memcpy(mesh->indices, indices, inst->numIndices*2);
		else
			for(int32 j = 0; j < inst->numIndices; j++)
				mesh->indices[j] = indices[j] + inst->minVert;
		unlockIndices(inst->indexBuffer);

		pipe->uninstanceCB(geo, inst);
		mesh++;
		inst++;
	}
	geo->generateTriangles();
	geo->flags &= ~Geometry::NATIVE;
	destroyNativeData(geo, 0, 0);
}